

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O0

UnqualifiedName * __thiscall soul::StructuralParser::parseUnqualifiedName(StructuralParser *this)

{
  bool bVar1;
  UnqualifiedName *pUVar2;
  CompileMessage local_80;
  char *local_48;
  Identifier local_30;
  Identifier identifier;
  Context context;
  StructuralParser *this_local;
  
  getContext((Context *)&identifier,this);
  local_30 = parseIdentifierWithMaxLength(this,0x80);
  local_48 = "::";
  bVar1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matches(&this->super_SOULTokeniser,(TokenType)0x54d85e);
  if (bVar1) {
    Errors::identifierMustBeUnqualified<>();
    (*(this->super_SOULTokeniser)._vptr_Tokeniser[2])(this,&local_80);
    CompileMessage::~CompileMessage(&local_80);
  }
  pUVar2 = allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                     (this,(Context *)&identifier,&local_30);
  AST::Context::~Context((Context *)&identifier);
  return pUVar2;
}

Assistant:

AST::UnqualifiedName& parseUnqualifiedName()
    {
        auto context = getContext();
        auto identifier = parseIdentifierWithMaxLength (AST::maxIdentifierLength);

        if (matches (Operator::doubleColon))
            throwError (Errors::identifierMustBeUnqualified());

        return allocate<AST::UnqualifiedName> (context, identifier);
    }